

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

Promise<kj::Array<unsigned_int>_>
kj::joinPromises<unsigned_int>(Array<kj::Promise<unsigned_int>_> *promises,SourceLocation location)

{
  size_t sVar1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar2;
  ExceptionOr<unsigned_int> *pEVar3;
  Promise<unsigned_int> *pPVar4;
  long in_RSI;
  anon_class_1_0_00000001 local_69;
  Array<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> local_68;
  ArrayJoinBehavior local_4c;
  Array<kj::_::ExceptionOr<unsigned_int>_> local_48;
  Mapper<kj::Array<kj::Promise<unsigned_int>_>_&> local_28;
  Promise<unsigned_int> *local_20;
  
  _::Mapper<kj::Array<kj::Promise<unsigned_int>_>_&>::
  operator*<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_inl_h:1659:7)>
            (&local_68,&local_28,&local_69);
  sVar1 = *(size_t *)(in_RSI + 8);
  local_48.ptr = (ExceptionOr<unsigned_int> *)
                 _::HeapArrayDisposer::allocateImpl
                           (0x1a0,sVar1,sVar1,
                            _::HeapArrayDisposer::Allocate_<kj::_::ExceptionOr<unsigned_int>_>::
                            construct,
                            ArrayDisposer::Dispose_<kj::_::ExceptionOr<unsigned_int>_>::destruct);
  local_48.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  local_4c = LAZY;
  local_48.size_ = sVar1;
  _::PromiseDisposer::
  alloc<kj::_::ArrayJoinPromiseNode<unsigned_int>,kj::_::PromiseDisposer,kj::Array<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>,kj::Array<kj::_::ExceptionOr<unsigned_int>>,kj::SourceLocation&,kj::_::ArrayJoinBehavior>
            ((PromiseDisposer *)&local_20,&local_68,&local_48,&location,&local_4c);
  pPVar4 = local_20;
  sVar1 = local_48.size_;
  pEVar3 = local_48.ptr;
  local_20 = (Promise<unsigned_int> *)0x0;
  promises->ptr = pPVar4;
  if (local_48.ptr != (ExceptionOr<unsigned_int> *)0x0) {
    local_48.ptr = (ExceptionOr<unsigned_int> *)0x0;
    local_48.size_ = 0;
    (**(local_48.disposer)->_vptr_ArrayDisposer)
              (local_48.disposer,pEVar3,0x1a0,sVar1,sVar1,
               ArrayDisposer::Dispose_<kj::_::ExceptionOr<unsigned_int>_>::destruct);
  }
  sVar1 = local_68.size_;
  pOVar2 = local_68.ptr;
  if (local_68.ptr != (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0) {
    local_68.ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0;
    local_68.size_ = 0;
    (**(local_68.disposer)->_vptr_ArrayDisposer)
              (local_68.disposer,pOVar2,8,sVar1,sVar1,
               ArrayDisposer::Dispose_<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::
               destruct);
  }
  return (PromiseBase)(PromiseBase)promises;
}

Assistant:

Promise<Array<T>> joinPromises(Array<Promise<T>>&& promises, SourceLocation location) {
  return _::PromiseNode::to<Promise<Array<T>>>(_::allocPromise<_::ArrayJoinPromiseNode<T>>(
      KJ_MAP(p, promises) { return _::PromiseNode::from(kj::mv(p)); },
      heapArray<_::ExceptionOr<T>>(promises.size()), location,
      _::ArrayJoinBehavior::LAZY));
}